

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<char,200ul>(ChArchiveOut *this,ChNameValue<char[200]> *bVal)

{
  size_t i;
  long lVar1;
  ChValueSpecific<char[200]> specVal;
  char buffer [20];
  char *local_98;
  char *local_90;
  undefined1 local_88;
  ChValueSpecific<char[200]> local_80;
  char local_48 [24];
  
  ChValueSpecific<char[200]>::ChValueSpecific(&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,&local_80,200);
  for (lVar1 = 0; lVar1 != 200; lVar1 = lVar1 + 1) {
    sprintf(local_48,"%lu",lVar1);
    local_90 = *bVal->_value + lVar1;
    local_88 = 0;
    local_98 = local_48;
    (*(this->super_ChArchive)._vptr_ChArchive[6])(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,&local_80,200);
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_80,200);
  ChValue::~ChValue(&local_80.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue<T[N]> bVal) {
          size_t arraysize = sizeof(bVal.value())/sizeof(T);
          ChValueSpecific<T[N]> specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, arraysize);
          }
          this->out_array_end(specVal, arraysize);
      }